

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O3

void skynet_updatetime(void)

{
  uint32_t *puVar1;
  byte bVar2;
  ulong uVar3;
  timer_node *ptVar4;
  timer_node *ptVar5;
  timer *ptVar6;
  uint uVar7;
  uint uVar8;
  link_list (*palVar9) [64];
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  timer_node *ret;
  timer_node *ptVar14;
  timespec ti;
  skynet_message local_48;
  
  clock_gettime(4,(timespec *)&local_48);
  ptVar6 = TI;
  uVar12 = ((long)local_48.data / 10000000 - (long)local_48.data / -0x6769800000000000) +
           CONCAT44(local_48.session,local_48.source) * 100;
  uVar3 = TI->current_point;
  if (uVar12 < uVar3) {
    skynet_error((skynet_context *)0x0,"time diff error: change from %lld to %lld",uVar12);
    TI->current_point = uVar12;
  }
  else if (uVar12 != uVar3) {
    uVar10 = (int)uVar12 - (int)uVar3;
    TI->current_point = uVar12;
    puVar1 = &ptVar6->current;
    uVar8 = *puVar1;
    *puVar1 = *puVar1 + uVar10;
    if (CARRY4(uVar8,uVar10)) {
      puVar1 = &ptVar6->starttime;
      *puVar1 = *puVar1 + 0x28f5c28;
    }
    if (uVar10 != 0) {
      uVar8 = 0;
      ptVar6 = TI;
      do {
        do {
          LOCK();
          iVar13 = (ptVar6->lock).lock;
          (ptVar6->lock).lock = 1;
          UNLOCK();
        } while (iVar13 != 0);
        uVar7 = ptVar6->time;
        ptVar14 = ptVar6->near[uVar7 & 0xff].head.next;
        if (ptVar14 != (timer_node *)0x0) {
          ptVar5 = &ptVar6->near[uVar7 & 0xff].head;
          do {
            ((timer_node *)&ptVar5->next)->next = (timer_node *)0x0;
            ptVar5[1].next = ptVar5;
            (ptVar6->lock).lock = 0;
            do {
              local_48.source = 0;
              local_48.session = *(int *)((long)&ptVar14[1].next + 4);
              local_48.data = (void *)0x0;
              local_48.sz = 0x100000000000000;
              skynet_context_push(*(uint32_t *)&ptVar14[1].next,&local_48);
              ptVar4 = ptVar14->next;
              free(ptVar14);
              ptVar14 = ptVar4;
            } while (ptVar4 != (timer_node *)0x0);
            do {
              LOCK();
              iVar13 = (ptVar6->lock).lock;
              (ptVar6->lock).lock = 1;
              UNLOCK();
            } while (iVar13 != 0);
            ptVar14 = ptVar5->next;
          } while (ptVar14 != (timer_node *)0x0);
          uVar7 = ptVar6->time;
        }
        uVar7 = uVar7 + 1;
        ptVar6->time = uVar7;
        if (uVar7 == 0) {
          ptVar14 = ptVar6->t[3][0].head.next;
          ptVar6->t[3][0].head.next = (timer_node *)0x0;
          ptVar6->t[3][0].tail = (timer_node *)(ptVar6->t + 3);
          while (ptVar14 != (timer_node *)0x0) {
            ptVar5 = ptVar14->next;
            add_node(ptVar6,ptVar14);
            ptVar14 = ptVar5;
          }
        }
        else if ((char)uVar7 == '\0') {
          uVar11 = uVar7 >> 8;
          palVar9 = ptVar6->t;
          iVar13 = 0x100;
LAB_00112f50:
          if ((uVar11 & 0x3f) == 0) goto code_r0x00112f57;
          ptVar14 = &(*palVar9)[uVar11 & 0x3f].head;
          ptVar5 = ((timer_node *)&ptVar14->next)->next;
          ((timer_node *)&ptVar14->next)->next = (timer_node *)0x0;
          ptVar14[1].next = ptVar14;
          while (ptVar5 != (timer_node *)0x0) {
            ptVar14 = ptVar5->next;
            add_node(ptVar6,ptVar5);
            ptVar5 = ptVar14;
          }
        }
LAB_00112f9d:
        bVar2 = (byte)ptVar6->time;
        ptVar14 = ptVar6->near[bVar2].head.next;
        if (ptVar14 != (timer_node *)0x0) {
          ptVar5 = &ptVar6->near[bVar2].head;
          do {
            ((timer_node *)&ptVar5->next)->next = (timer_node *)0x0;
            ptVar5[1].next = ptVar5;
            (ptVar6->lock).lock = 0;
            do {
              local_48.source = 0;
              local_48.session = *(int *)((long)&ptVar14[1].next + 4);
              local_48.data = (void *)0x0;
              local_48.sz = 0x100000000000000;
              skynet_context_push(*(uint32_t *)&ptVar14[1].next,&local_48);
              ptVar4 = ptVar14->next;
              free(ptVar14);
              ptVar14 = ptVar4;
            } while (ptVar4 != (timer_node *)0x0);
            do {
              LOCK();
              iVar13 = (ptVar6->lock).lock;
              (ptVar6->lock).lock = 1;
              UNLOCK();
            } while (iVar13 != 0);
            ptVar14 = ptVar5->next;
          } while (ptVar14 != (timer_node *)0x0);
        }
        (ptVar6->lock).lock = 0;
        uVar8 = uVar8 + 1;
        ptVar6 = TI;
      } while (uVar8 < uVar10);
    }
  }
  return;
code_r0x00112f57:
  iVar13 = iVar13 * 0x40;
  uVar11 = uVar11 >> 6;
  palVar9 = palVar9 + 1;
  if ((iVar13 - 1U & uVar7) != 0) goto LAB_00112f9d;
  goto LAB_00112f50;
}

Assistant:

void
skynet_updatetime(void) {
	uint64_t cp = gettime();
	if(cp < TI->current_point) {
		skynet_error(NULL, "time diff error: change from %lld to %lld", cp, TI->current_point);
		TI->current_point = cp;
	} else if (cp != TI->current_point) {
		uint32_t diff = (uint32_t)(cp - TI->current_point);
		TI->current_point = cp;

		uint32_t oc = TI->current;
		TI->current += diff;
		if (TI->current < oc) {
			// when cs > 0xffffffff(about 497 days), time rewind
			TI->starttime += 0xffffffff / 100;
		}
		int i;
		for (i=0;i<diff;i++) {
			timer_update(TI);
		}
	}
}